

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O2

void __thiscall OpenMD::OptimizationCreator::~OptimizationCreator(OptimizationCreator *this)

{
  this->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_002c0908;
  std::__cxx11::string::~string((string *)&this->ident_);
  return;
}

Assistant:

virtual ~OptimizationCreator() {}